

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O1

RK_U32 check_ref_dbp_err(H264_DecCtx_t *p_Dec,H264_RefPicInfo_t *pref,RK_U32 active_refs)

{
  ushort uVar1;
  uint index;
  h264d_video_ctx_t *phVar2;
  RK_U32 RVar3;
  RK_S32 *pRVar4;
  RK_U32 RVar5;
  ulong uVar6;
  MppFrame mframe;
  MppFrame local_38;
  
  pRVar4 = &pref->dpb_idx;
  uVar6 = 0;
  RVar5 = 0;
  do {
    if (((H264_RefPicInfo_t *)(pRVar4 + -1))->valid != 0) {
      local_38 = (MppFrame)0x0;
      index = p_Dec->dpb_info[*pRVar4].slot_index;
      if ((int)index < 0) {
        RVar5 = RVar5 | 1;
      }
      else {
        mpp_buf_slot_get_prop(p_Dec->frame_slots,index,SLOT_FRAME_PTR,&local_38);
        if (local_38 != (MppFrame)0x0) {
          if ((uVar6 < active_refs) &&
             (((phVar2 = p_Dec->p_Vid, (phVar2->recovery).valid_flag == 0 ||
               (uVar1 = p_Dec->dpb_info[*pRVar4].frame_num,
               (uint)uVar1 < (phVar2->recovery).first_frm_valid)) ||
              ((phVar2->recovery).recovery_pic_id <= (int)(uint)uVar1)))) {
            RVar3 = mpp_frame_get_errinfo(local_38);
            RVar5 = RVar5 | RVar3;
          }
          if ((h264d_debug._1_1_ & 0x10) != 0) {
            RVar3 = mpp_frame_get_errinfo(local_38);
            _mpp_log_l(4,"h264d_init","[DPB_REF_ERR] slot_idx=%d, dpb_err[%d]=%d",(char *)0x0,
                       (ulong)index,uVar6 & 0xffffffff,RVar3);
          }
        }
      }
      if ((int)index < 0) {
        return RVar5;
      }
    }
    uVar6 = uVar6 + 1;
    pRVar4 = pRVar4 + 3;
    if (uVar6 == 0x20) {
      return RVar5;
    }
  } while( true );
}

Assistant:

static RK_U32 check_ref_dbp_err(H264_DecCtx_t *p_Dec, H264_RefPicInfo_t *pref, RK_U32 active_refs)
{
    RK_U32 i = 0;
    RK_U32 dpb_error_flag = 0;

    for (i = 0; i < MAX_REF_SIZE; i++) {
        if (pref[i].valid) {
            MppFrame mframe = NULL;
            RK_S32 slot_idx = p_Dec->dpb_info[pref[i].dpb_idx].slot_index;
            if (slot_idx < 0) {
                dpb_error_flag |= 1;
                break;
            }
            mpp_buf_slot_get_prop(p_Dec->frame_slots, slot_idx, SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                if (i < active_refs
                    && (!p_Dec->p_Vid->recovery.valid_flag
                        || p_Dec->dpb_info[pref[i].dpb_idx].frame_num < p_Dec->p_Vid->recovery.first_frm_valid
                        || p_Dec->dpb_info[pref[i].dpb_idx].frame_num >= p_Dec->p_Vid->recovery.recovery_pic_id)) {
                    dpb_error_flag |= mpp_frame_get_errinfo(mframe);
                }
                H264D_DBG(H264D_DBG_DPB_REF_ERR, "[DPB_REF_ERR] slot_idx=%d, dpb_err[%d]=%d", slot_idx, i, mpp_frame_get_errinfo(mframe));
            }
        }
    }
    return dpb_error_flag;
}